

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

int png_crc_finish(png_structrp png_ptr,png_uint_32 skip)

{
  int iVar1;
  png_uint_32 length;
  png_byte tmpbuf [1024];
  png_byte apStack_428 [1024];
  
  if (skip != 0) {
    do {
      length = 0x400;
      if (skip < 0x400) {
        length = skip;
      }
      png_crc_read(png_ptr,apStack_428,length);
      skip = skip - length;
    } while (skip != 0);
  }
  iVar1 = png_crc_error(png_ptr);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    if ((png_ptr->chunk_name & 0x20000000) == 0) {
      if ((png_ptr->flags >> 10 & 1) == 0) {
LAB_00118518:
        png_chunk_error(png_ptr,"CRC error");
      }
    }
    else if ((png_ptr->flags >> 9 & 1) != 0) goto LAB_00118518;
    png_chunk_warning(png_ptr,"CRC error");
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int /* PRIVATE */
png_crc_finish(png_structrp png_ptr, png_uint_32 skip)
{
   /* The size of the local buffer for inflate is a good guess as to a
    * reasonable size to use for buffering reads from the application.
    */
   while (skip > 0)
   {
      png_uint_32 len;
      png_byte tmpbuf[PNG_INFLATE_BUF_SIZE];

      len = (sizeof tmpbuf);
      if (len > skip)
         len = skip;
      skip -= len;

      png_crc_read(png_ptr, tmpbuf, len);
   }

   if (png_crc_error(png_ptr) != 0)
   {
      if (PNG_CHUNK_ANCILLARY(png_ptr->chunk_name) != 0 ?
          (png_ptr->flags & PNG_FLAG_CRC_ANCILLARY_NOWARN) == 0 :
          (png_ptr->flags & PNG_FLAG_CRC_CRITICAL_USE) != 0)
      {
         png_chunk_warning(png_ptr, "CRC error");
      }

      else
         png_chunk_error(png_ptr, "CRC error");

      return (1);
   }

   return (0);
}